

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawTestCaseUtil.hpp
# Opt level: O0

TestInstance * __thiscall
vkt::Draw::
InstanceFactory<vkt::Draw::(anonymous_namespace)::IndirectDrawInstanced<vkt::Draw::(anonymous_namespace)::FirtsInstanceSupported>_>
::createInstance(InstanceFactory<vkt::Draw::(anonymous_namespace)::IndirectDrawInstanced<vkt::Draw::(anonymous_namespace)::FirtsInstanceSupported>_>
                 *this,Context *context)

{
  Context *context_00;
  TestInstance *this_00;
  DrawTypedTestSpec local_50;
  Context *local_18;
  Context *context_local;
  InstanceFactory<vkt::Draw::(anonymous_namespace)::IndirectDrawInstanced<vkt::Draw::(anonymous_namespace)::FirtsInstanceSupported>_>
  *this_local;
  
  local_18 = context;
  context_local = (Context *)this;
  this_00 = (TestInstance *)operator_new(0x218);
  context_00 = local_18;
  Draw::anon_unknown_0::DrawTypedTestSpec::DrawTypedTestSpec(&local_50,&this->m_testSpec);
  Draw::anon_unknown_0::
  IndirectDrawInstanced<vkt::Draw::(anonymous_namespace)::FirtsInstanceSupported>::
  IndirectDrawInstanced
            ((IndirectDrawInstanced<vkt::Draw::(anonymous_namespace)::FirtsInstanceSupported> *)
             this_00,context_00,&local_50);
  Draw::anon_unknown_0::DrawTypedTestSpec::~DrawTypedTestSpec(&local_50);
  return this_00;
}

Assistant:

TestInstance* createInstance (Context& context) const
	{
		return new Instance(context, m_testSpec);
	}